

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O2

string * __thiscall Color::colorize(string *__return_storage_ptr__,Color *this,string *input)

{
  uint uVar1;
  ostream *poVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  stringstream result;
  ostream local_1a0 [376];
  
  if (this->_value == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&result);
  uVar1 = this->_value;
  if ((uVar1 >> 0x15 & 1) != 0) {
    uVar4 = uVar1 & 0x40000;
    if (uVar4 != 0) {
      std::operator<<(local_1a0,"\x1b[4m");
      uVar1 = this->_value;
    }
    if ((uVar1 >> 0x16 & 1) == 0) {
      cVar3 = (char)(uVar4 >> 0x12);
    }
    else {
      std::operator<<(local_1a0,"\x1b[7m");
      uVar1 = this->_value;
      cVar3 = '\x01';
    }
    if ((uVar1 >> 0x13 & 1) != 0) {
      poVar2 = std::operator<<(local_1a0,"\x1b[38;5;");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,"m");
      uVar1 = this->_value;
      cVar3 = '\x01';
    }
    if ((uVar1 >> 0x14 & 1) != 0) {
      poVar2 = std::operator<<(local_1a0,"\x1b[48;5;");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      cVar3 = '\x01';
      std::operator<<(poVar2,"m");
    }
    std::operator<<(local_1a0,(string *)input);
    if (cVar3 != '\0') {
      std::operator<<(local_1a0,"\x1b[0m");
    }
    std::__cxx11::stringbuf::str();
    goto LAB_0010c885;
  }
  std::operator<<(local_1a0,"\x1b[");
  uVar1 = this->_value;
  if ((uVar1 >> 0x11 & 1) == 0) {
    iVar5 = 0;
    if ((uVar1 >> 0x12 & 1) != 0) {
      iVar5 = 1;
LAB_0010c7a6:
      std::operator<<(local_1a0,"4");
      uVar1 = this->_value;
    }
  }
  else {
    std::operator<<(local_1a0,"1");
    uVar1 = this->_value;
    if ((uVar1 >> 0x12 & 1) != 0) {
      std::operator<<(local_1a0,";");
      iVar5 = 2;
      goto LAB_0010c7a6;
    }
    iVar5 = 1;
  }
  if ((uVar1 >> 0x16 & 1) != 0) {
    if (iVar5 != 0) {
      std::operator<<(local_1a0,";");
    }
    std::operator<<(local_1a0,"7");
    uVar1 = this->_value;
    iVar5 = 1;
  }
  if ((uVar1 >> 0x13 & 1) == 0) {
    if ((uVar1 >> 0x14 & 1) != 0) {
      if (iVar5 != 0) goto LAB_0010c825;
code_r0x0010c847:
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    }
  }
  else {
    if (iVar5 != 0) {
      std::operator<<(local_1a0,";");
    }
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    if ((this->_value & 0x100000) != 0) {
LAB_0010c825:
      std::operator<<(local_1a0,";");
      goto code_r0x0010c847;
    }
  }
  poVar2 = std::operator<<(local_1a0,"m");
  poVar2 = std::operator<<(poVar2,(string *)input);
  std::operator<<(poVar2,"\x1b[0m");
  std::__cxx11::stringbuf::str();
LAB_0010c885:
  std::__cxx11::stringstream::~stringstream((stringstream *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string Color::colorize (const std::string& input)
{
#ifdef FEATURE_COLOR
  if (!nontrivial ())
    return input;

  int count = 0;
  std::stringstream result;

  // 256 color
  if (_value & _COLOR_256)
  {
    bool needTerminator = false;

    if (_value & _COLOR_UNDERLINE)
    {
      result << "\033[4m";
      needTerminator = true;
    }

    if (_value & _COLOR_INVERSE)
    {
      result << "\033[7m";
      needTerminator = true;
    }

    if (_value & _COLOR_HASFG)
    {
      result << "\033[38;5;" << (_value & _COLOR_FG) << "m";
      needTerminator = true;
    }

    if (_value & _COLOR_HASBG)
    {
      result << "\033[48;5;" << ((_value & _COLOR_BG) >> 8) << "m";
      needTerminator = true;
    }

    result << input;
    if (needTerminator)
      result << "\033[0m";

    return result.str ();
  }

  // 16 color
  else
  {
    result << "\033[";

    if (_value & _COLOR_BOLD)
    {
      if (count++) result << ";";
      result << "1";
    }

    if (_value & _COLOR_UNDERLINE)
    {
      if (count++) result << ";";
      result << "4";
    }

    if (_value & _COLOR_INVERSE)
    {
      if (count++) result << ";";
      result << "7";
    }

    if (_value & _COLOR_HASFG)
    {
      if (count++) result << ";";
      result << (29 + (_value & _COLOR_FG));
    }

    if (_value & _COLOR_HASBG)
    {
      if (count++) result << ";";
      result << ((_value & _COLOR_BRIGHT ? 99 : 39) + ((_value & _COLOR_BG) >> 8));
    }

    result << "m" << input << "\033[0m";
    return result.str ();
  }
#endif

  return input;
}